

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O1

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  uchar chain [16];
  uchar key [32];
  uchar tmp [48];
  mbedtls_aes_context aes_ctx;
  uchar buf [416];
  undefined8 local_368;
  undefined8 uStack_360;
  ulong local_358;
  ulong local_350;
  uchar local_348 [32];
  uchar local_328 [32];
  undefined8 local_308;
  undefined8 uStack_300;
  mbedtls_aes_context local_2f8;
  char local_1d8 [424];
  
  iVar1 = -0x38;
  if (data_len < 0x181) {
    lVar6 = 0;
    memset(local_1d8,0,0x1a0);
    mbedtls_aes_init(&local_2f8);
    local_1d8[0x10] = '\0';
    local_1d8[0x11] = '\0';
    local_1d8[0x12] = (char)(data_len >> 8);
    local_1d8[0x13] = (char)data_len;
    local_1d8[0x17] = 0x30;
    memcpy(local_1d8 + 0x18,data,data_len);
    local_1d8[data_len + 0x18] = -0x80;
    do {
      local_348[lVar6] = (uchar)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    iVar1 = mbedtls_aes_setkey_enc(&local_2f8,local_348,0x100);
    if (iVar1 == 0) {
      local_358 = data_len + 0x19;
      uVar2 = 0;
      do {
        local_368 = 0;
        uStack_360 = 0;
        pcVar7 = local_1d8;
        uVar4 = local_358;
        local_350 = uVar2;
        while (uVar4 != 0) {
          lVar6 = 0;
          do {
            *(byte *)((long)&local_368 + lVar6) =
                 *(byte *)((long)&local_368 + lVar6) ^ pcVar7[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x10);
          pcVar7 = pcVar7 + 0x10;
          bVar8 = uVar4 < 0x10;
          uVar4 = uVar4 - 0x10;
          if (bVar8) {
            uVar4 = 0;
          }
          iVar1 = mbedtls_aes_crypt_ecb(&local_2f8,1,(uchar *)&local_368,(uchar *)&local_368);
          if (iVar1 != 0) goto LAB_0010bf85;
        }
        local_1d8[3] = local_1d8[3] + '\x01';
        *(undefined8 *)(local_328 + local_350) = local_368;
        *(undefined8 *)(local_328 + local_350 + 8) = uStack_360;
        uVar2 = local_350 + 0x10;
      } while (local_350 < 0x20);
      iVar1 = mbedtls_aes_setkey_enc(&local_2f8,local_328,0x100);
      if (iVar1 == 0) {
        uVar3 = 0xfffffff0;
        puVar5 = output;
        do {
          iVar1 = mbedtls_aes_crypt_ecb(&local_2f8,1,(uchar *)&local_308,(uchar *)&local_308);
          if (iVar1 != 0) break;
          *(undefined8 *)puVar5 = local_308;
          *(undefined8 *)(puVar5 + 8) = uStack_300;
          puVar5 = puVar5 + 0x10;
          uVar3 = uVar3 + 0x10;
          iVar1 = 0;
        } while (uVar3 < 0x20);
      }
    }
LAB_0010bf85:
    mbedtls_aes_free(&local_2f8);
    lVar6 = 0;
    do {
      local_1d8[lVar6] = '\0';
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1a0);
    lVar6 = 0;
    do {
      local_328[lVar6] = '\0';
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x30);
    lVar6 = 0;
    do {
      local_348[lVar6] = '\0';
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    lVar6 = 0;
    do {
      *(undefined1 *)((long)&local_368 + lVar6) = 0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    if (iVar1 != 0) {
      lVar6 = 0;
      do {
        output[lVar6] = '\0';
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x30);
    }
  }
  return iVar1;
}

Assistant:

static int block_cipher_df( unsigned char *output,
                            const unsigned char *data, size_t data_len )
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;
    int ret = 0;

    int i, j;
    size_t buf_len, use_len;

    if( data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16 );
    mbedtls_aes_init( &aes_ctx );

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    *p++ = ( data_len >> 24 ) & 0xff;
    *p++ = ( data_len >> 16 ) & 0xff;
    *p++ = ( data_len >> 8  ) & 0xff;
    *p++ = ( data_len       ) & 0xff;
    p += 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy( p, data, data_len );
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for( i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++ )
        key[i] = i;

    if( ( ret = mbedtls_aes_setkey_enc( &aes_ctx, key, MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        goto exit;
    }

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        p = buf;
        memset( chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        use_len = buf_len;

        while( use_len > 0 )
        {
            for( i = 0; i < MBEDTLS_CTR_DRBG_BLOCKSIZE; i++ )
                chain[i] ^= p[i];
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= ( use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE ) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            if( ( ret = mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, chain, chain ) ) != 0 )
            {
                goto exit;
            }
        }

        memcpy( tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE );

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    if( ( ret = mbedtls_aes_setkey_enc( &aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        goto exit;
    }
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        if( ( ret = mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, iv, iv ) ) != 0 )
        {
            goto exit;
        }
        memcpy( p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }
exit:
    mbedtls_aes_free( &aes_ctx );
    /*
    * tidy up the stack
    */
    mbedtls_zeroize( buf, sizeof( buf ) );
    mbedtls_zeroize( tmp, sizeof( tmp ) );
    mbedtls_zeroize( key, sizeof( key ) );
    mbedtls_zeroize( chain, sizeof( chain ) );
    if( 0 != ret )
    {
        /*
        * wipe partial seed from memory
        */
        mbedtls_zeroize( output, MBEDTLS_CTR_DRBG_SEEDLEN );
    }

    return( ret );
}